

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::listInit
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  pointer plVar1;
  node *pnVar2;
  node *pnVar3;
  undefined1 *this_00;
  pair<int,_int> local_60;
  listNode<ft::pair<int,_int>_> local_58;
  pair<int,_int> local_30;
  listNode<ft::pair<int,_int>_> local_28;
  list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *local_10;
  list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this_local;
  
  this_00 = &this->field_0x18;
  local_10 = this;
  plVar1 = allocator<ft::listNode<ft::pair<int,_int>_>_>::allocate
                     ((allocator<ft::listNode<ft::pair<int,_int>_>_> *)this_00,1);
  this->m_head = plVar1;
  plVar1 = allocator<ft::listNode<ft::pair<int,_int>_>_>::allocate
                     ((allocator<ft::listNode<ft::pair<int,_int>_>_> *)this_00,1);
  this->m_tail = plVar1;
  plVar1 = this->m_head;
  pair<int,_int>::pair(&local_30);
  listNode<ft::pair<int,_int>_>::listNode(&local_28,&local_30);
  allocator<ft::listNode<ft::pair<int,_int>_>_>::construct
            ((allocator<ft::listNode<ft::pair<int,_int>_>_> *)this_00,plVar1,&local_28);
  listNode<ft::pair<int,_int>_>::~listNode(&local_28);
  pair<int,_int>::~pair(&local_30);
  plVar1 = this->m_tail;
  pair<int,_int>::pair(&local_60);
  listNode<ft::pair<int,_int>_>::listNode(&local_58,&local_60);
  allocator<ft::listNode<ft::pair<int,_int>_>_>::construct
            ((allocator<ft::listNode<ft::pair<int,_int>_>_> *)&this->field_0x18,plVar1,&local_58);
  listNode<ft::pair<int,_int>_>::~listNode(&local_58);
  pair<int,_int>::~pair(&local_60);
  pnVar2 = tail(this);
  pnVar3 = head(this);
  pnVar3->next = pnVar2;
  pnVar2 = head(this);
  pnVar3 = tail(this);
  pnVar3->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}